

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  MatCommaInitializer_<float> *pMVar3;
  MatCommaInitializer_ *pMVar4;
  clock_t cVar5;
  clock_t cVar6;
  clock_t cVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float v;
  float v_00;
  float v_01;
  float v_02;
  Intel_V4L2 *local_b68;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsLeft_t0;
  Vec3f rotation_euler;
  float local_b3c;
  float local_b38;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsLeft_t1;
  string filepath;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsRight_t0;
  vector<Matrix,_std::allocator<Matrix>_> pose_matrix_gt;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsRight_t1;
  string filename_pose;
  vector<bool,_std::allocator<bool>_> valid;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> newPoints;
  vector<FeaturePoint,_std::allocator<FeaturePoint>_> currentFeaturePointsLeft;
  vector<FeaturePoint,_std::allocator<FeaturePoint>_> oldFeaturePointsLeft;
  _OutputArray local_8b0;
  string strSettingPath;
  FeatureSet currentVOFeatures;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> oldPointsLeft_t0;
  string local_830 [32];
  string local_810 [32];
  FileStorage fSettings;
  string local_7b0 [32];
  _InputArray local_790 [4];
  Mat rotation;
  Mat projMatrr;
  Mat projMatrl;
  Mat xyz;
  Mat imageLeft_t1;
  Mat imageLeft_t0;
  Mat imageRight_t0;
  Mat translation;
  string local_430 [32];
  Mat points3D_t0;
  string local_3b0 [32];
  Mat imageRight_t0_color;
  Mat frame_pose;
  Mat trajectory;
  Mat points4D_t0;
  Mat points3D;
  Mat points4D;
  Mat frame_pose32;
  Mat Rpose;
  Mat pose;
  
  pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if (argc == 4) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Display ground truth trajectory");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string((string *)&filename_pose,argv[3],(allocator *)&projMatrl);
    std::__cxx11::string::string(local_7b0,(string *)&filename_pose);
    loadPoses(&projMatrl,local_7b0);
    std::vector<Matrix,_std::allocator<Matrix>_>::_M_move_assign(&pose_matrix_gt,&projMatrl);
    std::vector<Matrix,_std::allocator<Matrix>_>::~vector
              ((vector<Matrix,_std::allocator<Matrix>_> *)&projMatrl);
    std::__cxx11::string::~string(local_7b0);
    std::__cxx11::string::~string((string *)&filename_pose);
  }
  else if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Usage: ./run path_to_sequence(rgbd for using intel rgbd) path_to_calibration [optional]path_to_ground_truth_pose"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar9 = 1;
    goto LAB_001044af;
  }
  std::__cxx11::string::string((string *)&filepath,argv[1],(allocator *)&filename_pose);
  poVar2 = std::operator<<((ostream *)&std::cout,"Filepath: ");
  poVar2 = std::operator<<(poVar2,(string *)&filepath);
  std::endl<char,std::char_traits<char>>(poVar2);
  bVar1 = std::operator==(&filepath,"rgbd");
  std::__cxx11::string::string((string *)&strSettingPath,argv[2],(allocator *)&filename_pose);
  poVar2 = std::operator<<((ostream *)&std::cout,"Calibration Filepath: ");
  poVar2 = std::operator<<(poVar2,(string *)&strSettingPath);
  std::endl<char,std::char_traits<char>>(poVar2);
  filename_pose._M_dataplus._M_p = (pointer)&filename_pose.field_2;
  filename_pose._M_string_length = 0;
  filename_pose.field_2._M_allocated_capacity =
       filename_pose.field_2._M_allocated_capacity & 0xffffffffffffff00;
  cv::FileStorage::FileStorage(&fSettings,(string *)&strSettingPath,0,(string *)&filename_pose);
  std::__cxx11::string::~string((string *)&filename_pose);
  cv::FileStorage::operator[]((char *)&filename_pose);
  fVar10 = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::FileStorage::operator[]((char *)&filename_pose);
  v = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::FileStorage::operator[]((char *)&filename_pose);
  v_00 = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::FileStorage::operator[]((char *)&filename_pose);
  v_01 = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::FileStorage::operator[]((char *)&filename_pose);
  v_02 = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::Mat_<float>::Mat_((Mat_<float> *)&projMatrr,3,4);
  cv::operator<<((MatCommaInitializer_<float> *)&rotation,(Mat_<float> *)&projMatrr,fVar10);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_((MatCommaInitializer_<float> *)&rotation,0.0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,v_00);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,0.0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,0.0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,v);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,v_01);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,0.0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,0.0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,1.0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<float>::operator_(pMVar3,0.0);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<float> *)&filename_pose,pMVar4);
  cv::Mat::Mat(&projMatrl,(Mat *)&filename_pose);
  cv::Mat::~Mat((Mat *)&filename_pose);
  cv::Mat::~Mat(&projMatrr);
  cv::Mat_<float>::Mat_((Mat_<float> *)&rotation,3,4);
  cv::operator<<((MatCommaInitializer_<float> *)&translation,(Mat_<float> *)&rotation,fVar10);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_
                     ((MatCommaInitializer_<float> *)&translation,0.0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,v_00);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,v_02);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,0.0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,v);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,v_01);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,0.0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,0.0);
  pMVar3 = cv::MatCommaInitializer_<float>::operator_(pMVar3,1.0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<float>::operator_(pMVar3,0.0);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<float> *)&filename_pose,pMVar4);
  cv::Mat::Mat(&projMatrr,(Mat *)&filename_pose);
  cv::Mat::~Mat((Mat *)&filename_pose);
  cv::Mat::~Mat(&rotation);
  poVar2 = std::operator<<((ostream *)&std::cout,"P_left: ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  cv::operator<<(poVar2,&projMatrl);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"P_right: ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  cv::operator<<(poVar2,&projMatrr);
  std::endl<char,std::char_traits<char>>(poVar2);
  cv::Mat::eye((int)&filename_pose,3,3);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&rotation);
  cv::MatExpr::~MatExpr((MatExpr *)&filename_pose);
  cv::Mat::zeros((int)&filename_pose,3,1);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&translation);
  cv::MatExpr::~MatExpr((MatExpr *)&filename_pose);
  iVar9 = 1;
  cv::Mat::zeros((int)&filename_pose,3,1);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&pose);
  cv::MatExpr::~MatExpr((MatExpr *)&filename_pose);
  cv::Mat::eye((int)&filename_pose,3,3);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&Rpose);
  cv::MatExpr::~MatExpr((MatExpr *)&filename_pose);
  cv::Mat::eye((int)&filename_pose,4,4);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&frame_pose);
  cv::MatExpr::~MatExpr((MatExpr *)&filename_pose);
  cv::Mat::eye((int)&filename_pose,4,4);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&frame_pose32);
  cv::MatExpr::~MatExpr((MatExpr *)&filename_pose);
  poVar2 = std::operator<<((ostream *)&std::cout,"frame_pose ");
  cv::operator<<(poVar2,&frame_pose);
  std::endl<char,std::char_traits<char>>(poVar2);
  cv::Mat::zeros((int)&filename_pose,600,0x4b0);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&trajectory);
  cv::MatExpr::~MatExpr((MatExpr *)&filename_pose);
  currentVOFeatures.ages.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  currentVOFeatures.ages.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentVOFeatures.points.
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentVOFeatures.ages.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currentVOFeatures.points.
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currentVOFeatures.points.
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::Mat::Mat(&points4D);
  cv::Mat::Mat(&points3D);
  cv::Mat::Mat(&imageRight_t0);
  cv::Mat::Mat(&imageLeft_t0);
  if (bVar1) {
    local_b68 = (Intel_V4L2 *)operator_new(0x38);
    Intel_V4L2::Intel_V4L2(local_b68);
    for (iVar8 = 10; -1 < iVar8; iVar8 = iVar8 + -1) {
      (**(code **)(*(long *)local_b68 + 0x18))(local_b68,&imageLeft_t0,&imageRight_t0);
    }
  }
  else {
    cv::Mat::Mat((Mat *)&filename_pose);
    std::__cxx11::string::string(local_810,(string *)&filepath);
    loadImageLeft(&filename_pose,&imageLeft_t0,0,local_810);
    std::__cxx11::string::~string(local_810);
    cv::Mat::Mat(&imageRight_t0_color);
    std::__cxx11::string::string(local_830,(string *)&filepath);
    loadImageRight(&imageRight_t0_color,&imageRight_t0,0,local_830);
    std::__cxx11::string::~string(local_830);
    cv::Mat::~Mat(&imageRight_t0_color);
    cv::Mat::~Mat((Mat *)&filename_pose);
    local_b68 = (Intel_V4L2 *)0x0;
  }
  oldFeaturePointsLeft.super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  oldFeaturePointsLeft.super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  oldFeaturePointsLeft.super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  currentFeaturePointsLeft.super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentFeaturePointsLeft.super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currentFeaturePointsLeft.super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; iVar9 != 9000; iVar9 = iVar9 + 1) {
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::operator<<(poVar2,"frame id ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar9);
    std::endl<char,std::char_traits<char>>(poVar2);
    cv::Mat::Mat(&imageRight_t0_color);
    cv::Mat::Mat(&imageLeft_t1);
    if (bVar1) {
      (**(code **)(*(long *)local_b68 + 0x18))(local_b68,&imageLeft_t1,&imageRight_t0_color);
    }
    else {
      cv::Mat::Mat((Mat *)&filename_pose);
      std::__cxx11::string::string(local_3b0,(string *)&filepath);
      loadImageLeft(&filename_pose,&imageLeft_t1,iVar9,local_3b0);
      std::__cxx11::string::~string(local_3b0);
      cv::Mat::Mat(&points3D_t0);
      std::__cxx11::string::string(local_430,(string *)&filepath);
      loadImageRight(&points3D_t0,&imageRight_t0_color,iVar9,local_430);
      std::__cxx11::string::~string(local_430);
      cv::Mat::~Mat(&points3D_t0);
      cv::Mat::~Mat((Mat *)&filename_pose);
    }
    cVar5 = clock();
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
              (&oldPointsLeft_t0,&currentVOFeatures.points);
    pointsLeft_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    pointsLeft_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    pointsLeft_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointsRight_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pointsRight_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pointsRight_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointsLeft_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    pointsLeft_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    pointsLeft_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointsRight_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pointsRight_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pointsRight_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    matchingFeatures(&imageLeft_t0,&imageRight_t0,&imageLeft_t1,&imageRight_t0_color,
                     &currentVOFeatures,(vector *)&pointsLeft_t0,(vector *)&pointsRight_t0,
                     (vector *)&pointsLeft_t1,(vector *)&pointsRight_t1);
    cv::Mat::operator=(&imageLeft_t0,&imageLeft_t1);
    cv::Mat::operator=(&imageRight_t0,&imageRight_t0_color);
    newPoints.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    newPoints.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    newPoints.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    cv::Mat::Mat(&points3D_t0);
    cv::Mat::Mat(&points4D_t0);
    filename_pose.field_2._M_allocated_capacity = 0;
    filename_pose._M_dataplus._M_p._0_4_ = 0x1010000;
    filename_pose._M_string_length = (size_type)&projMatrl;
    _xyz = 0x1010000;
    local_790[0].sz.width = 0;
    local_790[0].sz.height = 0;
    local_790[0].flags = -0x7efcfff3;
    local_790[0].obj = &pointsLeft_t0;
    local_8b0.super__InputArray.sz.width = 0;
    local_8b0.super__InputArray.sz.height = 0;
    _rotation_euler = -2.4060936e-38;
    local_8b0.super__InputArray.flags = 0x2010000;
    local_8b0.super__InputArray.obj = &points4D_t0;
    cv::triangulatePoints
              ((_InputArray *)&filename_pose,(_InputArray *)&xyz,local_790,
               (_InputArray *)&rotation_euler,&local_8b0);
    cv::Mat::t();
    cv::_InputArray::_InputArray((_InputArray *)&xyz,(MatExpr *)&filename_pose);
    local_790[0].sz.width = 0;
    local_790[0].sz.height = 0;
    local_790[0].flags = 0x2010000;
    local_790[0].obj = &points3D_t0;
    cv::convertPointsFromHomogeneous((_InputArray *)&xyz,(_OutputArray *)local_790);
    cv::MatExpr::~MatExpr((MatExpr *)&filename_pose);
    cVar6 = clock();
    trackingFrame2Frame(&projMatrl,&projMatrr,(vector *)&pointsLeft_t0,(vector *)&pointsLeft_t1,
                        &points3D_t0,&rotation,&translation,false);
    cVar7 = clock();
    poVar2 = std::operator<<((ostream *)&std::cerr,"tracking frame 2 frame: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,((float)(cVar7 - cVar6) / 1e+06) * 1000.0);
    poVar2 = std::operator<<(poVar2,"ms");
    std::endl<char,std::char_traits<char>>(poVar2);
    displayTracking(&imageLeft_t1,(vector *)&pointsLeft_t0,(vector *)&pointsLeft_t1);
    rotationMatrixToEulerAngles((Mat *)&rotation_euler);
    cv::Mat::Mat((Mat *)&filename_pose);
    if (((0.1 <= ABS(local_b3c)) || (0.1 <= ABS(_rotation_euler))) ||
       (local_b38 = SUB84(&pointsRight_t0,0), 0.1 <= ABS(local_b38))) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Too large rotation");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      integrateOdometryStereo(iVar9,(Mat *)&filename_pose,&frame_pose,&rotation,&translation);
    }
    cVar6 = clock();
    poVar2 = std::operator<<((ostream *)&std::cout,"[Info] frame times (ms): ");
    fVar10 = (float)(((double)(cVar6 - cVar5) * 1000.0) / 1000000.0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar10);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"[Info] FPS: ");
    fVar10 = 1000.0 / fVar10;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar10);
    std::endl<char,std::char_traits<char>>(poVar2);
    cv::Mat::col((Mat *)local_790,(int)&frame_pose);
    cv::Mat::clone();
    cv::Mat::~Mat((Mat *)local_790);
    display(iVar9,&trajectory,&xyz,(vector *)&pose_matrix_gt,fVar10,argc == 4);
    cv::Mat::~Mat(&xyz);
    cv::Mat::~Mat((Mat *)&filename_pose);
    cv::Mat::~Mat(&points4D_t0);
    cv::Mat::~Mat(&points3D_t0);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&valid.super__Bvector_base<std::allocator<bool>_>);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&newPoints.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
              );
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&pointsRight_t1.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&pointsLeft_t1.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&pointsRight_t0.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&pointsLeft_t0.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&oldPointsLeft_t0.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    cv::Mat::~Mat(&imageLeft_t1);
    cv::Mat::~Mat(&imageRight_t0_color);
  }
  std::_Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>::~_Vector_base
            (&currentFeaturePointsLeft.
              super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>);
  std::_Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>::~_Vector_base
            (&oldFeaturePointsLeft.super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>);
  cv::Mat::~Mat(&imageLeft_t0);
  cv::Mat::~Mat(&imageRight_t0);
  cv::Mat::~Mat(&points3D);
  cv::Mat::~Mat(&points4D);
  FeatureSet::~FeatureSet(&currentVOFeatures);
  cv::Mat::~Mat(&trajectory);
  cv::Mat::~Mat(&frame_pose32);
  cv::Mat::~Mat(&frame_pose);
  cv::Mat::~Mat(&Rpose);
  cv::Mat::~Mat(&pose);
  cv::Mat::~Mat(&translation);
  cv::Mat::~Mat(&rotation);
  cv::Mat::~Mat(&projMatrr);
  cv::Mat::~Mat(&projMatrl);
  cv::FileStorage::~FileStorage(&fSettings);
  std::__cxx11::string::~string((string *)&strSettingPath);
  std::__cxx11::string::~string((string *)&filepath);
  iVar9 = 0;
LAB_001044af:
  std::vector<Matrix,_std::allocator<Matrix>_>::~vector(&pose_matrix_gt);
  return iVar9;
}

Assistant:

int main(int argc, char **argv)
{

    // -----------------------------------------
    // Load images and calibration parameters
    // -----------------------------------------
    bool display_ground_truth = false;
    bool use_intel_rgbd = false;
    std::vector<Matrix> pose_matrix_gt;
    if(argc == 4)
    {   display_ground_truth = true;
        cerr << "Display ground truth trajectory" << endl;
        // load ground truth pose
        string filename_pose = string(argv[3]);
        pose_matrix_gt = loadPoses(filename_pose);

    }
    if(argc < 3)
    {
        cerr << "Usage: ./run path_to_sequence(rgbd for using intel rgbd) path_to_calibration [optional]path_to_ground_truth_pose" << endl;
        return 1;
    }

    // Sequence
    string filepath = string(argv[1]);
    cout << "Filepath: " << filepath << endl;

    if(filepath == "rgbd") use_intel_rgbd = true;

    // Camera calibration
    string strSettingPath = string(argv[2]);
    cout << "Calibration Filepath: " << strSettingPath << endl;

    cv::FileStorage fSettings(strSettingPath, cv::FileStorage::READ);

    
    float fx = fSettings["Camera.fx"];
    float fy = fSettings["Camera.fy"];
    float cx = fSettings["Camera.cx"];
    float cy = fSettings["Camera.cy"];
    float bf = fSettings["Camera.bf"];

    cv::Mat projMatrl = (cv::Mat_<float>(3, 4) << fx, 0., cx, 0., 0., fy, cy, 0., 0,  0., 1., 0.);
    cv::Mat projMatrr = (cv::Mat_<float>(3, 4) << fx, 0., cx, bf, 0., fy, cy, 0., 0,  0., 1., 0.);
    cout << "P_left: " << endl << projMatrl << endl;
    cout << "P_right: " << endl << projMatrr << endl;

    // -----------------------------------------
    // Initialize variables
    // -----------------------------------------
    cv::Mat rotation = cv::Mat::eye(3, 3, CV_64F);
    cv::Mat translation = cv::Mat::zeros(3, 1, CV_64F);

    cv::Mat pose = cv::Mat::zeros(3, 1, CV_64F);
    cv::Mat Rpose = cv::Mat::eye(3, 3, CV_64F);
    
    cv::Mat frame_pose = cv::Mat::eye(4, 4, CV_64F);
    cv::Mat frame_pose32 = cv::Mat::eye(4, 4, CV_32F);

    std::cout << "frame_pose " << frame_pose << std::endl;
    cv::Mat trajectory = cv::Mat::zeros(600, 1200, CV_8UC3);
    FeatureSet currentVOFeatures;
    cv::Mat points4D, points3D;
    int init_frame_id = 0;

    // ------------------------
    // Load first images
    // ------------------------
    cv::Mat imageRight_t0,  imageLeft_t0;
    CameraBase *pCamera = NULL;
    if(use_intel_rgbd)
    {   
        pCamera = new Intel_V4L2;
        for (int throw_frames = 10 ; throw_frames >=0 ; throw_frames--)
            pCamera->getLRFrames(imageLeft_t0,imageRight_t0);
    }
    else
    {
        cv::Mat imageLeft_t0_color;
        loadImageLeft(imageLeft_t0_color,  imageLeft_t0, init_frame_id, filepath);
        
        cv::Mat imageRight_t0_color;  
        loadImageRight(imageRight_t0_color, imageRight_t0, init_frame_id, filepath);
    }
    clock_t t_a, t_b;

    // -----------------------------------------
    // Run visual odometry
    // -----------------------------------------
    std::vector<FeaturePoint> oldFeaturePointsLeft;
    std::vector<FeaturePoint> currentFeaturePointsLeft;

    for (int frame_id = init_frame_id+1; frame_id < 9000; frame_id++)
    {

        std::cout << std::endl << "frame id " << frame_id << std::endl;
        // ------------
        // Load images
        // ------------
        cv::Mat imageRight_t1,  imageLeft_t1;
        if(use_intel_rgbd)
        {
            pCamera->getLRFrames(imageLeft_t1,imageRight_t1);
        }
        else
        {
            cv::Mat imageLeft_t1_color;
            loadImageLeft(imageLeft_t1_color,  imageLeft_t1, frame_id, filepath);        
            cv::Mat imageRight_t1_color;  
            loadImageRight(imageRight_t1_color, imageRight_t1, frame_id, filepath);            
        }


        t_a = clock();
        std::vector<cv::Point2f> oldPointsLeft_t0 = currentVOFeatures.points;


        std::vector<cv::Point2f> pointsLeft_t0, pointsRight_t0, pointsLeft_t1, pointsRight_t1;  
        matchingFeatures( imageLeft_t0, imageRight_t0,
                          imageLeft_t1, imageRight_t1, 
                          currentVOFeatures,
                          pointsLeft_t0, 
                          pointsRight_t0, 
                          pointsLeft_t1, 
                          pointsRight_t1);  

        imageLeft_t0 = imageLeft_t1;
        imageRight_t0 = imageRight_t1;

        std::vector<cv::Point2f>& currentPointsLeft_t0 = pointsLeft_t0;
        std::vector<cv::Point2f>& currentPointsLeft_t1 = pointsLeft_t1;
        
        std::vector<cv::Point2f> newPoints;
        std::vector<bool> valid; // valid new points are ture

        // ---------------------
        // Triangulate 3D Points
        // ---------------------
        cv::Mat points3D_t0, points4D_t0;
        cv::triangulatePoints( projMatrl,  projMatrr,  pointsLeft_t0,  pointsRight_t0,  points4D_t0);
        cv::convertPointsFromHomogeneous(points4D_t0.t(), points3D_t0);

/*        cv::Mat points3D_t1, points4D_t1;
        cv::triangulatePoints( projMatrl,  projMatrr,  pointsLeft_t1,  pointsRight_t1,  points4D_t1);
        cv::convertPointsFromHomogeneous(points4D_t1.t(), points3D_t1);*/

        // ---------------------
        // Tracking transfomation
        // ---------------------
	clock_t tic_gpu = clock();
        trackingFrame2Frame(projMatrl, projMatrr, pointsLeft_t0, pointsLeft_t1, points3D_t0, rotation, translation, false);
	clock_t toc_gpu = clock();
	std::cerr << "tracking frame 2 frame: " << float(toc_gpu - tic_gpu)/CLOCKS_PER_SEC*1000 << "ms" << std::endl;
        displayTracking(imageLeft_t1, pointsLeft_t0, pointsLeft_t1);


/*        points4D = points4D_t0;
        frame_pose.convertTo(frame_pose32, CV_32F);
        points4D = frame_pose32 * points4D;
        cv::convertPointsFromHomogeneous(points4D.t(), points3D);*/

        // ------------------------------------------------
        // Intergrating and display
        // ------------------------------------------------

        cv::Vec3f rotation_euler = rotationMatrixToEulerAngles(rotation);


        cv::Mat rigid_body_transformation;

        if(abs(rotation_euler[1])<0.1 && abs(rotation_euler[0])<0.1 && abs(rotation_euler[2])<0.1)
        {
            integrateOdometryStereo(frame_id, rigid_body_transformation, frame_pose, rotation, translation);

        } else {

            std::cout << "Too large rotation"  << std::endl;
        }
        t_b = clock();
        float frame_time = 1000*(double)(t_b-t_a)/CLOCKS_PER_SEC;
        float fps = 1000/frame_time;
        cout << "[Info] frame times (ms): " << frame_time << endl;
        cout << "[Info] FPS: " << fps << endl;

        // std::cout << "rigid_body_transformation" << rigid_body_transformation << std::endl;
        // std::cout << "rotation: " << rotation_euler << std::endl;
        // std::cout << "translation: " << translation.t() << std::endl;
        // std::cout << "frame_pose" << frame_pose << std::endl;


        cv::Mat xyz = frame_pose.col(3).clone();
        display(frame_id, trajectory, xyz, pose_matrix_gt, fps, display_ground_truth);

    }

    return 0;
}